

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar uVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  _Bool _Var5;
  CURLUcode CVar6;
  int iVar7;
  CURLU *u_00;
  Curl_handler *pCVar8;
  uchar *__s;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  uchar uVar13;
  long lVar14;
  char cVar15;
  uchar *puVar16;
  uchar *puVar17;
  byte local_58;
  CURLU *local_50;
  char *oldurl;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  CVar6 = CURLUE_UNKNOWN_PART;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      goto switchD_004361fc_caseD_0;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  cVar15 = (char)flags;
  switch(what) {
  case CURLUPART_URL:
    _Var5 = Curl_is_absolute_url(part,(char *)0x0,8);
    if ((!_Var5) && (CVar6 = curl_url_get(u,CURLUPART_URL,&oldurl,flags), CVar6 == CURLUE_OK)) {
      pcVar11 = Curl_concat_url(oldurl,part);
      (*Curl_cfree)(oldurl);
      if (pcVar11 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      u_00 = (CURLU *)(*Curl_ccalloc)(0x58,1);
      if (u_00 == (CURLU *)0x0) {
        (*Curl_cfree)(pcVar11);
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar6 = parseurl(pcVar11,u_00,flags);
      (*Curl_cfree)(pcVar11);
joined_r0x00436649:
      if (CVar6 == CURLUE_OK) {
        mv_urlhandle(u_00,u);
        return CURLUE_OK;
      }
      curl_url_cleanup(u_00);
      return CVar6;
    }
    u_00 = (CURLU *)(*Curl_ccalloc)(0x58,1);
    if (u_00 != (CURLU *)0x0) {
      CVar6 = parseurl(part,u_00,flags);
      goto joined_r0x00436649;
    }
    goto LAB_004365d6;
  case CURLUPART_SCHEME:
    if (((flags & 8) == 0) && (pCVar8 = Curl_builtin_scheme(part), pCVar8 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    lVar14 = 0;
    local_50 = u;
    goto LAB_00436438;
  case CURLUPART_USER:
    local_50 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_50 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_50 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_50 = (CURLU *)&u->host;
    break;
  case CURLUPART_PORT:
    lVar14 = strtol(part,(char **)0x0,10);
    if (lVar14 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    local_50 = (CURLU *)&u->port;
LAB_00436438:
    local_58 = 0;
    goto LAB_00436440;
  case CURLUPART_PATH:
    local_50 = (CURLU *)&u->path;
    local_58 = 0;
    if (cVar15 < '\0') {
      bVar4 = 1;
      bVar3 = false;
      goto LAB_0043628f;
    }
    goto LAB_0043627b;
  case CURLUPART_QUERY:
    local_58 = (byte)(flags >> 8) & 1;
    local_50 = (CURLU *)&u->query;
    lVar14 = 0;
    if (cVar15 < '\0') {
      bVar4 = 0;
      bVar3 = true;
      goto LAB_0043628f;
    }
    goto LAB_00436440;
  case CURLUPART_FRAGMENT:
    local_50 = (CURLU *)&u->fragment;
    break;
  default:
    goto switchD_00436168_default;
  }
  local_58 = 0;
  if (cVar15 < '\0') {
    bVar3 = false;
    bVar4 = 0;
LAB_0043628f:
    sVar9 = strlen(part);
    __s = (uchar *)(*Curl_cmalloc)(sVar9 * 3 + 1);
    if (__s == (uchar *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    if (bVar3) {
      lVar14 = 0;
      while( true ) {
        uVar1 = part[lVar14];
        uVar13 = '+';
        if ((uVar1 != ' ') && (uVar13 = uVar1, uVar1 == '\0')) break;
        __s[lVar14] = uVar13;
        lVar14 = lVar14 + 1;
      }
      __s[lVar14] = '\0';
      part = (*Curl_cstrdup)((char *)__s);
      if ((uchar *)part == (uchar *)0x0) {
        (*Curl_cfree)(__s);
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    puVar16 = __s;
    for (puVar17 = (uchar *)part; *puVar17 != '\0'; puVar17 = puVar17 + 1) {
      _Var5 = Curl_isunreserved(*puVar17);
      uVar1 = *puVar17;
      if (_Var5) {
LAB_00436318:
        *puVar16 = uVar1;
        lVar14 = 1;
      }
      else {
        if ((((bool)(bVar3 & uVar1 == '+')) || ((bool)(uVar1 == '/' & bVar4))) ||
           ((uVar1 == '=' & local_58) != 0)) goto LAB_00436318;
        curl_msnprintf((char *)puVar16,4,"%%%02x",(ulong)(uint)(int)(char)uVar1);
        lVar14 = 3;
      }
      puVar16 = puVar16 + lVar14;
    }
    *puVar16 = '\0';
    if (bVar3) {
      (*Curl_cfree)(part);
    }
    lVar14 = 0;
joined_r0x00436387:
    if (((local_58 == 0) || (pcVar11 = u->query, pcVar11 == (char *)0x0)) ||
       (sVar9 = strlen(pcVar11), sVar9 == 0)) {
      (*Curl_cfree)(local_50->scheme);
      local_50->scheme = (char *)__s;
      if (lVar14 != 0) {
        u->portnum = lVar14;
        return CURLUE_OK;
      }
      return CURLUE_OK;
    }
    cVar15 = pcVar11[sVar9 - 1];
    sVar10 = strlen((char *)__s);
    lVar14 = (cVar15 != '&') + sVar9;
    pcVar11 = (char *)(*Curl_cmalloc)(sVar10 + lVar14 + 1);
    if (pcVar11 != (char *)0x0) {
      strcpy(pcVar11,u->query);
      if (cVar15 != '&') {
        pcVar11[sVar9] = '&';
      }
      strcpy(pcVar11 + lVar14,(char *)__s);
      (*Curl_cfree)(__s);
      (*Curl_cfree)(local_50->scheme);
      local_50->scheme = pcVar11;
switchD_004361fc_caseD_0:
      return CURLUE_OK;
    }
    (*Curl_cfree)(__s);
  }
  else {
LAB_0043627b:
    local_58 = 0;
    lVar14 = 0;
LAB_00436440:
    __s = (uchar *)(*Curl_cstrdup)(part);
    if (__s != (uchar *)0x0) {
      lVar2 = 1;
      puVar16 = __s;
      do {
        lVar12 = lVar2;
        if (*puVar16 == '%') {
          iVar7 = Curl_isxdigit((uint)puVar16[1]);
          if (((iVar7 != 0) && (iVar7 = Curl_isxdigit((uint)puVar16[2]), iVar7 != 0)) &&
             ((iVar7 = Curl_isupper((uint)puVar16[1]), iVar7 != 0 ||
              (iVar7 = Curl_isupper((uint)puVar16[2]), iVar7 != 0)))) {
            iVar7 = tolower((uint)puVar16[1]);
            puVar16[1] = (uchar)iVar7;
            iVar7 = tolower((uint)puVar16[2]);
            puVar16[2] = (uchar)iVar7;
            lVar12 = 3;
          }
        }
        else if (*puVar16 == '\0') goto joined_r0x00436387;
        puVar16 = puVar16 + lVar12;
      } while( true );
    }
  }
LAB_004365d6:
  CVar6 = CURLUE_OUT_OF_MEMORY;
switchD_00436168_default:
  return CVar6;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_PORT:
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    break;
  case CURLUPART_PORT:
    urlencode = FALSE; /* never */
    port = strtol(part, NULL, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
    break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = Curl_concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(urlencode) {
      const char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && appendquery) ||
           ((*i == '+') && plusencode)) {
          *o = *i;
          o++;
        }
        else {
          snprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}